

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

ptls_cipher_suite_t * find_cipher(ptls_context_t *ctx,uint16_t id)

{
  ptls_cipher_suite_t **local_28;
  ptls_cipher_suite_t **cs;
  uint16_t id_local;
  ptls_context_t *ctx_local;
  
  local_28 = ctx->cipher_suites;
  while( true ) {
    if (*local_28 == (ptls_cipher_suite_t *)0x0) {
      return (ptls_cipher_suite_t *)0x0;
    }
    if ((*local_28)->id == id) break;
    local_28 = local_28 + 1;
  }
  return *local_28;
}

Assistant:

static ptls_cipher_suite_t *find_cipher(ptls_context_t *ctx, uint16_t id)
{
    ptls_cipher_suite_t **cs;
    for (cs = ctx->cipher_suites; *cs != NULL; ++cs)
        if ((*cs)->id == id)
            return *cs;
    return NULL;
}